

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_expression.cc
# Opt level: O1

int __thiscall
tchecker::typed_ite_expression_t::clone
          (typed_ite_expression_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  typed_expression_t *ptVar1;
  typed_ite_expression_t *this_00;
  shared_ptr<const_tchecker::typed_expression_t> else_value_clone;
  shared_ptr<const_tchecker::typed_expression_t> then_value_clone;
  shared_ptr<const_tchecker::typed_expression_t> condition_clone;
  shared_ptr<const_tchecker::typed_expression_t> local_40;
  shared_ptr<const_tchecker::typed_expression_t> local_30;
  shared_ptr<const_tchecker::typed_expression_t> local_20;
  
  ptVar1 = condition(this);
  local_20.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(**(code **)(*(long *)ptVar1 + 0x28))(ptVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::typed_expression_t*>
            (&local_20.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_20.
             super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  ptVar1 = then_value(this);
  local_30.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(**(code **)(*(long *)ptVar1 + 0x28))(ptVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::typed_expression_t*>
            (&local_30.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_30.
             super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  ptVar1 = else_value(this);
  local_40.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(**(code **)(*(long *)ptVar1 + 0x28))(ptVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::typed_expression_t*>
            (&local_40.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_40.
             super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  this_00 = (typed_ite_expression_t *)operator_new(0x48);
  typed_ite_expression_t
            (this_00,(this->super_typed_expression_t)._type,&local_20,&local_30,&local_40);
  if (local_40.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_30.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_20.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (int)this_00;
}

Assistant:

tchecker::typed_ite_expression_t * typed_ite_expression_t::clone() const
{
  std::shared_ptr<tchecker::typed_expression_t const> condition_clone{condition().clone()};
  std::shared_ptr<tchecker::typed_expression_t const> then_value_clone{then_value().clone()};
  std::shared_ptr<tchecker::typed_expression_t const> else_value_clone{else_value().clone()};
  return new tchecker::typed_ite_expression_t(_type, condition_clone, then_value_clone, else_value_clone);
}